

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall
testing::internal::FilePath::ConcatPaths(FilePath *this,FilePath *directory,FilePath *relative_path)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  FilePath FVar5;
  String *this_00;
  String local_40;
  undefined1 local_30 [8];
  FilePath dir;
  FilePath *relative_path_local;
  FilePath *directory_local;
  
  dir.pathname_.length_ = (size_t)relative_path;
  bVar1 = IsEmpty(directory);
  if (bVar1) {
    FilePath(this,(FilePath *)dir.pathname_.length_);
    sVar4 = extraout_RDX;
  }
  else {
    this_00 = (String *)local_30;
    RemoveTrailingPathSeparator((FilePath *)this_00);
    pcVar2 = c_str((FilePath *)this_00);
    pcVar3 = c_str((FilePath *)dir.pathname_.length_);
    String::Format(&local_40,"%s%c%s",pcVar2,0x2f,pcVar3);
    FilePath(this,&local_40);
    String::~String(this_00);
    ~FilePath((FilePath *)local_30);
    sVar4 = extraout_RDX_00;
  }
  FVar5.pathname_.length_ = sVar4;
  FVar5.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar5.pathname_;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(String::Format("%s%c%s", dir.c_str(), kPathSeparator,
                                 relative_path.c_str()));
}